

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O0

Boolean MA_chop_stack(Integer memhandle)

{
  int iVar1;
  Boolean BVar2;
  AD *ad;
  AD **in_stack_00000010;
  char *in_stack_00000020;
  BlockLocation in_stack_0000002c;
  AD **in_stack_00000030;
  Integer in_stack_00000038;
  undefined8 local_18;
  _func_void_AD_ptr *in_stack_fffffffffffffff8;
  
  ma_stats.calls[2] = ma_stats.calls[2] + 1;
  BVar2 = mh2ad(in_stack_00000038,in_stack_00000030,in_stack_0000002c,in_stack_00000020);
  if (BVar2 != 0) {
    iVar1 = list_delete_many(in_stack_00000010,(_func_Boolean_AD_ptr_Pointer *)memhandle,(Pointer)ad
                             ,in_stack_fffffffffffffff8);
    ma_stats.sblocks = ma_stats.sblocks - (long)iVar1;
    ma_stats.sbytes = ma_stats.sbytes - ((local_18 + *(long *)(local_18 + 0x38)) - (long)ma_sp);
    ma_sp = (Pointer)(local_18 + *(long *)(local_18 + 0x38));
  }
  return (ulong)(BVar2 != 0);
}

Assistant:

public Boolean MA_chop_stack(Integer memhandle)/*the block to deallocate up to*/
{
    AD        *ad;        /* AD for memhandle */

#ifdef STATS
    ma_stats.calls[(int)FID_MA_chop_stack]++;
#endif /* STATS */

#ifdef VERIFY
    if (ma_auto_verify && !MA_verify_allocator_stuff())
        return MA_FALSE;
#endif /* VERIFY */

    /* verify memhandle and convert to AD */
    if (!mh2ad(memhandle, &ad, BL_Stack, "MA_chop_stack"))
        return MA_FALSE;

    /* delete block and all blocks above it from used list */
#ifdef STATS
    ma_stats.sblocks -=
        list_delete_many(&ma_sused, ad_le, (Pointer)ad, mh_free);
#else
    (void)list_delete_many(&ma_sused, ad_le, (Pointer)ad, mh_free);
#endif /* STATS */

    /* pop block and all blocks above it from stack */
#ifdef STATS
    ma_stats.sbytes -= (((Pointer)ad + ad->nbytes) - ma_sp);
#endif /* STATS */
    ma_sp = (Pointer)ad + ad->nbytes;

    /* success */
    return MA_TRUE;
}